

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

google_protobuf_EnumValueDescriptorProto *
enumvaldef_toproto(upb_ToProto_Context *ctx,upb_EnumValueDef *e)

{
  upb_Arena *a;
  _Bool _Var1;
  int32_t iVar2;
  upb_DecodeStatus uVar3;
  google_protobuf_EnumValueDescriptorProto *msg;
  char *pcVar4;
  google_protobuf_EnumValueOptions *msg_00;
  upb_Message *msg_01;
  size_t size;
  char *ptr;
  undefined8 local_38;
  
  msg = (google_protobuf_EnumValueDescriptorProto *)
        _upb_Message_New(&google__protobuf__EnumValueDescriptorProto_msg_init,ctx->arena);
  if (msg != (google_protobuf_EnumValueDescriptorProto *)0x0) {
    pcVar4 = upb_EnumValueDef_Name(e);
    _ptr = strviewdup(ctx,pcVar4);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130cf0,&ptr);
    iVar2 = upb_EnumValueDef_Number(e);
    ptr._0_4_ = iVar2;
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130b94,&ptr);
    _Var1 = upb_EnumValueDef_HasOptions(e);
    if (!_Var1) {
      return msg;
    }
    msg_00 = upb_EnumValueDef_Options(e);
    upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__EnumValueOptions_msg_init,0,ctx->arena,&ptr,&size);
    pcVar4 = ptr;
    if (ptr != (char *)0x0) {
      a = ctx->arena;
      msg_01 = _upb_Message_New(&google__protobuf__EnumValueOptions_msg_init,a);
      if ((msg_01 != (upb_Message *)0x0) &&
         (uVar3 = upb_Decode(pcVar4,size,msg_01,&google__protobuf__EnumValueOptions_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,a), uVar3 == kUpb_DecodeStatus_Ok)) {
        ptr = (char *)msg_01;
        upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130ba0,&ptr);
        return msg;
      }
    }
  }
  longjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_EnumValueDescriptorProto* enumvaldef_toproto(
    upb_ToProto_Context* ctx, const upb_EnumValueDef* e) {
  google_protobuf_EnumValueDescriptorProto* proto =
      google_protobuf_EnumValueDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_EnumValueDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_EnumValueDef_Name(e)));
  google_protobuf_EnumValueDescriptorProto_set_number(proto, upb_EnumValueDef_Number(e));

  if (upb_EnumValueDef_HasOptions(e)) {
    SET_OPTIONS(proto, EnumValueDescriptorProto, EnumValueOptions,
                upb_EnumValueDef_Options(e));
  }

  return proto;
}